

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void ImFontAtlasUpdateConfigDataPointers(ImFontAtlas *atlas)

{
  undefined2 uVar1;
  ImFont *pIVar2;
  ImFontConfig *font_cfg;
  ImFontConfig *pIVar3;
  long lVar4;
  short sVar5;
  
  pIVar3 = (atlas->ConfigData).Data;
  for (lVar4 = (long)(atlas->ConfigData).Size * 0x90; lVar4 != 0; lVar4 = lVar4 + -0x90) {
    pIVar2 = pIVar3->DstFont;
    if (pIVar3->MergeMode == true) {
      uVar1 = pIVar2->ConfigDataCount;
      sVar5 = uVar1 + 1;
    }
    else {
      pIVar2->ConfigData = pIVar3;
      sVar5 = 1;
    }
    pIVar2->ConfigDataCount = sVar5;
    pIVar3 = pIVar3 + 1;
  }
  return;
}

Assistant:

inline T*           begin()                             { return Data; }